

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

string * __thiscall
pfederc::ProgNameExpr::toString_abi_cxx11_(string *__return_storage_ptr__,ProgNameExpr *this)

{
  Token *pTVar1;
  Lexer *pLVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ProgNameExpr *local_18;
  ProgNameExpr *this_local;
  
  local_18 = this;
  this_local = (ProgNameExpr *)__return_storage_ptr__;
  pTVar1 = getToken(this);
  pLVar2 = Expr::getLexer(&this->super_Expr);
  (*pTVar1->_vptr_Token[2])(&local_38,pTVar1,pLVar2);
  std::operator+(__return_storage_ptr__,"use module ",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string ProgNameExpr::toString() const noexcept {
  return "use module " + getToken().toString(getLexer());
}